

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.h
# Opt level: O0

ct * __thiscall ct::toStr<unsigned_int>(ct *this,uint *DOUBLE)

{
  ostringstream local_190 [8];
  ostringstream os;
  uint *DOUBLE_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::operator<<((ostream *)local_190,*DOUBLE);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return this;
}

Assistant:

::std::string toStr(const T& DOUBLE) {
    ::std::ostringstream os;
    os << DOUBLE;
    return os.str();
}